

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t insert_string(char *p)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  char *q;
  char *line;
  int i;
  size_t len;
  char *p_local;
  
  __n = strlen(p);
  if (Length <= (long)rl_end + __n) {
    pcVar2 = (char *)malloc(Length + __n + 0x40);
    if (pcVar2 == (char *)0x0) {
      return CSstay;
    }
    if (Length != 0) {
      memcpy(pcVar2,rl_line_buffer,Length);
      free(rl_line_buffer);
    }
    Length = __n + 0x40 + Length;
    rl_line_buffer = pcVar2;
  }
  iVar1 = rl_point;
  pcVar2 = rl_line_buffer;
  line._4_4_ = rl_end - rl_point;
  while (line._4_4_ = line._4_4_ + -1, -1 < line._4_4_) {
    pcVar2[__n + (long)line._4_4_ + (long)iVar1] = pcVar2[(long)line._4_4_ + (long)iVar1];
  }
  memcpy(rl_line_buffer + rl_point,p,__n);
  rl_end = rl_end + (int)__n;
  rl_line_buffer[rl_end] = '\0';
  tty_string(rl_line_buffer + rl_point);
  rl_point = rl_point + (int)__n;
  p_local._4_4_ = CSmove;
  if (rl_point == rl_end) {
    p_local._4_4_ = CSstay;
  }
  return p_local._4_4_;
}

Assistant:

static el_status_t insert_string(const char *p)
{
    size_t      len;
    int         i;
    char        *line;
    char        *q;

    len = strlen(p);
    if (rl_end + len >= Length) {
        line = malloc(sizeof(char) * (Length + len + MEM_INC));
        if (!line)
            return CSstay;

        if (Length) {
            memcpy(line, rl_line_buffer, Length);
            free(rl_line_buffer);
        }

        rl_line_buffer = line;
        Length += len + MEM_INC;
    }

    for (q = &rl_line_buffer[rl_point], i = rl_end - rl_point; --i >= 0; )
        q[len + i] = q[i];

    memcpy(&rl_line_buffer[rl_point], p, len);
    rl_end += len;
    rl_line_buffer[rl_end] = '\0';
    tty_string(&rl_line_buffer[rl_point]);
    rl_point += len;

    return rl_point == rl_end ? CSstay : CSmove;
}